

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O2

set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_> * __thiscall
GLRState::statesOnInput
          (set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_>
           *__return_storage_ptr__,GLRState *this,string *input)

{
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  __type _Var2;
  GLRState *in_RAX;
  _Base_ptr p_Var3;
  GLRState *local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38 = in_RAX;
  for (p_Var3 = (this->statesTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->statesTo)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(p_Var3 + 1);
    _Var2 = std::operator==(__lhs,input);
    if (_Var2) {
      local_38 = (GLRState *)__lhs[1]._M_dataplus._M_p;
      std::
      _Rb_tree<GLRState*,GLRState*,std::_Identity<GLRState*>,std::less<GLRState*>,std::allocator<GLRState*>>
      ::_M_insert_unique<GLRState*>
                ((_Rb_tree<GLRState*,GLRState*,std::_Identity<GLRState*>,std::less<GLRState*>,std::allocator<GLRState*>>
                  *)__return_storage_ptr__,&local_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<GLRState *> GLRState::statesOnInput(const std::string &input) {
    std::set<GLRState *> statesOnInp;
    for (GLRTransition *state: statesTo) {
        if (state->getLabel() == input) {
            statesOnInp.insert(state->getStateTo());
        }
    }
    return statesOnInp;
}